

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# so2.hpp
# Opt level: O3

Transformation __thiscall
Sophus::SO2Base<Sophus::SO2<float,_0>_>::matrix(SO2Base<Sophus::SO2<float,_0>_> *this)

{
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar1;
  Scalar *in_RSI;
  undefined8 extraout_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Transformation TVar2;
  Scalar local_34;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> local_30;
  
  local_30.m_row = 0;
  local_30.m_col = 1;
  local_30.m_currentBlockRows = 1;
  *(Scalar *)this = *in_RSI;
  local_34 = -in_RSI[1];
  local_30.m_xpr = (Matrix<float,_2,_2,_0,_2,_2> *)this;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (&local_30,&local_34);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar1,in_RSI + 1);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_(pCVar1,in_RSI);
  if ((local_30.m_currentBlockRows + local_30.m_row == 2) && (local_30.m_col == 2)) {
    TVar2.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] =
         (float)(int)in_XMM1_Qa;
    TVar2.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3] =
         (float)(int)((ulong)in_XMM1_Qa >> 0x20);
    TVar2.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
         (float)(int)extraout_XMM0_Qa;
    TVar2.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[1] =
         (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
    return (Transformation)
           TVar2.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 2>>::finished() [MatrixType = Eigen::Matrix<float, 2, 2>]"
               );
}

Assistant:

matrix() const {
    Scalar const& real = unit_complex().x();
    Scalar const& imag = unit_complex().y();
    Transformation R;
    // clang-format off
        R <<
             real, -imag,
                imag,  real;
    // clang-format on
    return R;
  }